

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O1

RegEx * YAML::Exp::ChompIndicator(void)

{
  int iVar1;
  string local_30;
  
  if (ChompIndicator()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&ChompIndicator()::e);
    if (iVar1 != 0) {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"+-","");
      RegEx::RegEx(&ChompIndicator::e,&local_30,REGEX_OR);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p);
      }
      __cxa_atexit(RegEx::~RegEx,&ChompIndicator::e,&__dso_handle);
      __cxa_guard_release(&ChompIndicator()::e);
    }
  }
  return &ChompIndicator::e;
}

Assistant:

inline const RegEx& ChompIndicator() {
  static const RegEx e = RegEx("+-", REGEX_OR);
  return e;
}